

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmloutput.cpp
# Opt level: O2

void __thiscall XmlOutput::newTagOpen(XmlOutput *this,QString *tag)

{
  QTextStream *pQVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  closeOpen(this);
  if (this->format == NewLine) {
    pQVar1 = (QTextStream *)Qt::endl(this->xmlFile);
    QTextStream::operator<<(pQVar1,(QString *)&this->currentIndent);
  }
  pQVar1 = (QTextStream *)QTextStream::operator<<(this->xmlFile,'<');
  doConversion((QString *)&local_40,this,tag);
  QTextStream::operator<<(pQVar1,(QString *)&local_40);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  this->currentState = Attribute;
  QList<QString>::emplaceBack<QString_const&>(&(this->tagStack).super_QList<QString>,tag);
  increaseIndent(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void XmlOutput::newTagOpen(const QString &tag)
{
    Q_ASSERT_X(tag.size(), "XmlOutput", "Cannot open an empty tag");
    closeOpen();

    if (format == NewLine)
        xmlFile << Qt::endl << currentIndent;
    xmlFile << '<' << doConversion(tag);
    currentState = Attribute;
    tagStack.append(tag);
    increaseIndent(); // ---> indent
}